

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakeDirectoryCommand.cxx
# Opt level: O1

bool __thiscall
cmMakeDirectoryCommand::InitialPass
          (cmMakeDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string e;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) {
    bVar2 = cmMakefile::CanIWriteThisFile
                      ((this->super_cmCommand).Makefile,(pbVar1->_M_dataplus)._M_p);
    if (bVar2) {
      cmsys::SystemTools::MakeDirectory
                ((((args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      return true;
    }
    std::operator+(&local_30,"attempted to create a directory: ",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_50.field_2._M_allocated_capacity = *psVar4;
      local_50.field_2._8_8_ = plVar3[3];
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar4;
      local_50._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_50._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmMakeDirectoryCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() != 1) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  if (!this->Makefile->CanIWriteThisFile(args[0].c_str())) {
    std::string e = "attempted to create a directory: " + args[0] +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  cmSystemTools::MakeDirectory(args[0].c_str());
  return true;
}